

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O1

PointerReader *
capnp::_::PointerReader::getRoot
          (PointerReader *__return_storage_ptr__,SegmentReader *segment,CapTableReader *capTable,
          word *location,int nestingLimit)

{
  uint64_t uVar1;
  DebugExpression<bool> _kjCondition;
  Fault f;
  
  if (segment == (SegmentReader *)0x0) {
LAB_001818ac:
    __return_storage_ptr__->segment = segment;
    __return_storage_ptr__->capTable = capTable;
    __return_storage_ptr__->pointer = (WirePointer *)location;
    __return_storage_ptr__->nestingLimit = nestingLimit;
    return __return_storage_ptr__;
  }
  if ((segment->ptr).size_ < ((long)location - (long)(segment->ptr).ptr >> 3) + 1U) {
    _kjCondition.value = false;
  }
  else {
    uVar1 = segment->readLimiter->limit;
    if (uVar1 == 0) {
      (*segment->arena->_vptr_Arena[3])();
    }
    else {
      segment->readLimiter->limit = uVar1 - 1;
    }
    _kjCondition.value = uVar1 != 0;
    if (_kjCondition.value) goto LAB_001818ac;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[29]>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
             ,0xa94,FAILED,"WireHelpers::boundsCheck(segment, location, POINTER_SIZE_IN_WORDS)",
             "_kjCondition,\"Root location out-of-bounds.\"",&_kjCondition,
             (char (*) [29])"Root location out-of-bounds.");
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

PointerReader PointerReader::getRoot(SegmentReader* segment, CapTableReader* capTable,
                                     const word* location, int nestingLimit) {
  KJ_REQUIRE(WireHelpers::boundsCheck(segment, location, POINTER_SIZE_IN_WORDS),
             "Root location out-of-bounds.") {
    location = nullptr;
  }

  return PointerReader(segment, capTable,
      reinterpret_cast<const WirePointer*>(location), nestingLimit);
}